

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_MapEntryKeyTypeBytes_Test::TestBody
          (ValidationErrorTest_MapEntryKeyTypeBytes_Test *this)

{
  DescriptorProto *pDVar1;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  FieldDescriptorProto *local_120;
  FieldDescriptorProto *key;
  undefined1 local_108 [8];
  FileDescriptorProto file_proto;
  ValidationErrorTest_MapEntryKeyTypeBytes_Test *this_local;
  
  file_proto.field_0._224_8_ = this;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_108);
  anon_unknown_532::FillValidMapEntry((FileDescriptorProto *)local_108);
  pDVar1 = FileDescriptorProto::mutable_message_type((FileDescriptorProto *)local_108,0);
  pDVar1 = DescriptorProto::mutable_nested_type(pDVar1,0);
  local_120 = DescriptorProto::mutable_field(pDVar1,0);
  FieldDescriptorProto::set_type(local_120,FieldDescriptorProto_Type_TYPE_BYTES);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_138,descriptor_unittest::(anonymous_namespace)::kMapEntryKeyTypeErrorMessage);
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,(FileDescriptorProto *)local_108,&local_138);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_138);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_108);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, MapEntryKeyTypeBytes) {
  FileDescriptorProto file_proto;
  FillValidMapEntry(&file_proto);
  FieldDescriptorProto* key =
      file_proto.mutable_message_type(0)->mutable_nested_type(0)->mutable_field(
          0);
  key->set_type(FieldDescriptorProto::TYPE_BYTES);
  BuildFileWithErrors(file_proto, kMapEntryKeyTypeErrorMessage);
}